

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR get_argument(lysp_yang_ctx *ctx,yang_arg arg,uint16_t *flags,char **word_p,char **word_b,
                   size_t *word_len)

{
  uint64_t *puVar1;
  byte bVar2;
  ly_in *plVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  LY_ERR LVar7;
  char *pcVar8;
  uint8_t comment;
  ly_ctx *plVar9;
  int iVar10;
  uint8_t prefix;
  size_t *local_80;
  undefined8 local_78;
  undefined8 local_70;
  long local_68;
  char **local_60;
  size_t buf_len;
  char **local_50;
  long local_48;
  long local_40;
  ushort *local_38;
  
  buf_len = 0;
  prefix = '\0';
  *word_b = (char *)0x0;
  *word_p = (char *)0x0;
  *word_len = 0;
  local_80 = word_len;
  local_60 = word_p;
  local_50 = word_b;
  local_38 = flags;
  bVar5 = false;
  do {
    plVar3 = ctx->in;
    pbVar4 = (byte *)plVar3->current;
    bVar2 = *pbVar4;
    bVar6 = bVar5;
    if (bVar2 < 0x22) {
      if (bVar2 < 0xd) {
        if (bVar2 == 9) {
          bVar6 = true;
          if (*word_len == 0) {
            ctx->indent = ctx->indent + 8;
            plVar3->current = (char *)(pbVar4 + 1);
            bVar6 = bVar5;
          }
        }
        else {
          if (bVar2 != 10) {
            if (bVar2 != 0) goto LAB_00173b4a;
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
LAB_00173dd4:
            LVar7 = LY_EVALID;
            goto LAB_00173dda;
          }
LAB_001734ae:
          bVar6 = true;
          if (*word_len == 0) {
            plVar3 = ctx->in;
            puVar1 = &plVar3->line;
            *puVar1 = *puVar1 + 1;
            ly_in_skip(plVar3,1);
            ctx->indent = 0;
            bVar6 = bVar5;
          }
        }
      }
      else {
        if (bVar2 == 0xd) {
          if (pbVar4[1] != 10) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",0xd);
            goto LAB_00173dd4;
          }
          ly_in_skip(plVar3,1);
          ctx->indent = ctx->indent + 1;
          goto LAB_001734ae;
        }
        if (bVar2 != 0x20) goto LAB_00173b4a;
        bVar6 = true;
        if (*word_len == 0) {
          ly_in_skip(plVar3,1);
          ctx->indent = ctx->indent + 1;
          bVar6 = bVar5;
        }
      }
    }
    else if (bVar2 < 0x3b) {
      if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
        if (*word_len != 0) {
LAB_00173cb8:
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar8 = "unquoted string character, optsep, semicolon or opening brace";
LAB_00173db3:
          ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s."
                  ,1,pbVar4,pcVar8);
          goto LAB_00173dd4;
        }
        if (local_38 != (ushort *)0x0) {
          *local_38 = *local_38 | (ushort)(bVar2 != 0x27) * 0x100 + 0x100;
        }
        if (*pbVar4 == 0x27) {
          iVar10 = 1;
          local_68 = 0;
        }
        else {
          if (*pbVar4 != 0x22) {
            __assert_fail("ctx->in->current[0] == \'\\\'\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                          ,0x158,
                          "LY_ERR read_qstring(struct lysp_yang_ctx *, enum yang_arg, char **, char **, size_t *, size_t *)"
                         );
          }
          local_68 = ctx->indent + 1;
          iVar10 = 2;
        }
        ly_in_skip(plVar3,1);
        ctx->indent = ctx->indent + 1;
        if (*ctx->in->current != '\0') {
          local_40 = 8 - local_68;
          local_78 = 0;
          local_48 = local_68;
          local_70 = 0;
          LVar7 = (*(code *)(&DAT_001da260 + *(int *)(&DAT_001da260 + (ulong)(iVar10 - 1) * 4)))();
          return LVar7;
        }
        LVar7 = LY_SUCCESS;
        if ((arg < Y_STR_ARG) && (*local_80 == 0)) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Statement argument is required.");
          LVar7 = LY_EVALID;
        }
        word_b = local_50;
        if (LVar7 != LY_SUCCESS) goto LAB_00173dda;
        word_len = local_80;
        word_p = local_60;
        bVar6 = true;
        if (*local_60 == (char *)0x0) {
          *local_60 = "";
        }
      }
      else {
        if (bVar2 != 0x2f) goto LAB_00173b4a;
        if (pbVar4[1] == 0x2f) {
          bVar5 = false;
          comment = '\x01';
        }
        else if (pbVar4[1] == 0x2a) {
          comment = '\x02';
          bVar5 = false;
        }
        else {
          LVar7 = buf_store_char(ctx,arg,word_p,word_len,word_b,&buf_len,'\0',&prefix);
          if (LVar7 != LY_SUCCESS) goto LAB_00173dda;
          bVar5 = true;
          comment = '\0';
        }
        word_len = local_80;
        if (!bVar5) {
          if (*local_80 != 0) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX,
                    "Invalid comment sequence \"%.2s\" in an unquoted string.",ctx->in->current);
            goto LAB_00173dd4;
          }
          ly_in_skip(ctx->in,2);
          ctx->indent = ctx->indent + 2;
          LVar7 = skip_comment(ctx,comment);
          word_len = local_80;
          goto joined_r0x00173b36;
        }
      }
    }
    else if ((bVar2 == 0x3b) || (bVar2 == 0x7b)) {
      bVar6 = true;
      if ((arg != Y_MAYBE_STR_ARG) && (*word_len == 0)) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar9 = (ly_ctx *)0x0;
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar8 = "an argument";
        goto LAB_00173db3;
      }
    }
    else {
      if (bVar2 == 0x7d) goto LAB_00173cb8;
LAB_00173b4a:
      LVar7 = buf_store_char(ctx,arg,word_p,word_len,word_b,&buf_len,'\0',&prefix);
joined_r0x00173b36:
      if (LVar7 != LY_SUCCESS) {
LAB_00173dda:
        free(*word_b);
        *word_b = (char *)0x0;
        return LVar7;
      }
    }
    bVar5 = bVar6;
    if (bVar6) {
      LVar7 = LY_SUCCESS;
      if (*word_b != (char *)0x0) {
        pcVar8 = (char *)ly_realloc(*word_b,*word_len + 1);
        *word_b = pcVar8;
        if (pcVar8 == (char *)0x0) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar7 = LY_EMEM;
          ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","get_argument");
        }
        else {
          pcVar8[*word_len] = '\0';
          *word_p = *word_b;
        }
      }
      return LVar7;
    }
  } while( true );
}

Assistant:

LY_ERR
get_argument(struct lysp_yang_ctx *ctx, enum yang_arg arg, uint16_t *flags, char **word_p,
        char **word_b, size_t *word_len)
{
    LY_ERR ret;
    size_t buf_len = 0;
    uint8_t prefix = 0;
    ly_bool str_end = 0;
    int comment;

    /* word buffer - dynamically allocated */
    *word_b = NULL;

    /* word pointer - just a pointer to data */
    *word_p = NULL;

    *word_len = 0;
    while (!str_end) {
        switch (ctx->in->current[0]) {
        case '\'':
        case '\"':
            if (*word_len) {
                /* invalid - quotes cannot be in unquoted string and only optsep, ; or { can follow it */
                LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                        "unquoted string character, optsep, semicolon or opening brace");
                ret = LY_EVALID;
                goto error;
            }
            if (flags) {
                (*flags) |= (ctx->in->current[0] == '\'') ? LYS_SINGLEQUOTED : LYS_DOUBLEQUOTED;
            }

            LY_CHECK_GOTO(ret = read_qstring(ctx, arg, word_p, word_b, word_len, &buf_len), error);
            if (!*word_p) {
                /* do not return NULL word */
                *word_p = "";
            }
            str_end = 1;
            break;
        case '/':
            comment = 0;
            if (ctx->in->current[1] == '/') {
                /* one-line comment */
                comment = 1;
            } else if (ctx->in->current[1] == '*') {
                /* block comment */
                comment = 2;
            } else {
                /* not a comment after all */
                LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            }

            if (comment) {
                if (*word_len) {
                    /* invalid comment sequence (RFC 7950 sec. 6.1.3.) */
                    LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Invalid comment sequence \"%.2s\" in an unquoted string.", ctx->in->current);
                    ret = LY_EVALID;
                    goto error;
                }

                /* skip the comment */
                MOVE_INPUT(ctx, 2);
                LY_CHECK_GOTO(ret = skip_comment(ctx, comment), error);
            }
            break;
        case ' ':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            MOVE_INPUT(ctx, 1);
            break;
        case '\t':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            /* tabs count for 8 spaces */
            ctx->indent += Y_TAB_SPACES;

            ++ctx->in->current;
            break;
        case '\r':
            if (ctx->in->current[1] != '\n') {
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[0]);
                ret = LY_EVALID;
                goto error;
            }
            MOVE_INPUT(ctx, 1);
        /* fallthrough */
        case '\n':
            if (*word_len) {
                /* word is finished */
                str_end = 1;
                break;
            }
            LY_IN_NEW_LINE(ctx->in);
            MOVE_INPUT(ctx, 1);

            /* reset indent */
            ctx->indent = 0;
            break;
        case ';':
        case '{':
            if (*word_len || (arg == Y_MAYBE_STR_ARG)) {
                /* word is finished */
                str_end = 1;
                break;
            }

            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current, "an argument");
            ret = LY_EVALID;
            goto error;
        case '}':
            /* invalid - braces cannot be in unquoted string (opening braces terminates the string and can follow it) */
            LOGVAL_PARSER(ctx, LY_VCODE_INSTREXP, 1, ctx->in->current,
                    "unquoted string character, optsep, semicolon or opening brace");
            ret = LY_EVALID;
            goto error;
        case '\0':
            /* unexpected EOF */
            LOGVAL_PARSER(ctx, LY_VCODE_EOF);
            ret = LY_EVALID;
            goto error;
        default:
            LY_CHECK_GOTO(ret = buf_store_char(ctx, arg, word_p, word_len, word_b, &buf_len, 0, &prefix), error);
            break;
        }
    }

    /* terminating NULL byte for buf */
    if (*word_b) {
        (*word_b) = ly_realloc(*word_b, (*word_len) + 1);
        LY_CHECK_ERR_RET(!(*word_b), LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
        (*word_b)[*word_len] = '\0';
        *word_p = *word_b;
    }

    return LY_SUCCESS;

error:
    free(*word_b);
    *word_b = NULL;
    return ret;
}